

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O0

void __thiscall IZDeflate::ct_init(IZDeflate *this,ush *attr,int *method)

{
  uint uVar1;
  int local_34;
  int local_30;
  int dist;
  int code;
  int length;
  int bits;
  int n;
  int *method_local;
  ush *attr_local;
  IZDeflate *this_local;
  
  this->file_type = attr;
  this->file_method = method;
  this->cmpr_len_bits = 0;
  this->cmpr_bytelen = 0;
  dist = 0;
  for (local_30 = 0; local_30 < 0x1c; local_30 = local_30 + 1) {
    this->base_length[local_30] = dist;
    for (length = 0; length < 1 << ((byte)this->extra_lbits[local_30] & 0x1f); length = length + 1)
    {
      this->length_code[dist] = (uch)local_30;
      dist = dist + 1;
    }
  }
  this->length_code[dist + -1] = (uch)local_30;
  local_34 = 0;
  for (local_30 = 0; local_30 < 0x10; local_30 = local_30 + 1) {
    this->base_dist[local_30] = local_34;
    for (length = 0; length < 1 << ((byte)this->extra_dbits[local_30] & 0x1f); length = length + 1)
    {
      this->dist_code[local_34] = (uch)local_30;
      local_34 = local_34 + 1;
    }
  }
  local_34 = local_34 >> 7;
  for (; local_30 < 0x1e; local_30 = local_30 + 1) {
    this->base_dist[local_30] = local_34 << 7;
    for (length = 0; length < 1 << ((char)this->extra_dbits[local_30] - 7U & 0x1f);
        length = length + 1) {
      this->dist_code[local_34 + 0x100] = (uch)local_30;
      local_34 = local_34 + 1;
    }
  }
  for (code = 0; code < 0x10; code = code + 1) {
    this->bl_count[code] = 0;
  }
  length = 0;
  while (length < 0x90) {
    this->static_ltree[length].dl.dad = 8;
    this->bl_count[8] = this->bl_count[8] + 1;
    length = length + 1;
  }
  while (length < 0x100) {
    this->static_ltree[length].dl.dad = 9;
    this->bl_count[9] = this->bl_count[9] + 1;
    length = length + 1;
  }
  while (length < 0x118) {
    this->static_ltree[length].dl.dad = 7;
    this->bl_count[7] = this->bl_count[7] + 1;
    length = length + 1;
  }
  while (length < 0x120) {
    this->static_ltree[length].dl.dad = 8;
    this->bl_count[8] = this->bl_count[8] + 1;
    length = length + 1;
  }
  gen_codes(this,this->static_ltree,0x11f);
  for (length = 0; length < 0x1e; length = length + 1) {
    this->static_dtree[length].dl.dad = 5;
    uVar1 = bi_reverse(this,length,5);
    this->static_dtree[length].fc.freq = (ush)uVar1;
  }
  init_block(this);
  return;
}

Assistant:

void IZDeflate::ct_init(ush *attr, int * method)
    // ush  *attr;   /* pointer to internal file attribute */
    // int  *method; /* pointer to compression method */
{
    int n;        /* iterates over tree elements */
    int bits;     /* bit counter */
    int length;   /* length value */
    int code;     /* code value */
    int dist;     /* distance index */

    file_type = attr;
    file_method = method;
    cmpr_len_bits = 0L;
    cmpr_bytelen = (uzoff_t)0;
#ifdef DEBUG
    input_len = (uzoff_t)0;
#endif

#if 0
// READ OF UNITIALIZED MEM!
    if (static_dtree[0].Len != 0) return; /* ct_init already called */
#endif

#ifdef DYN_ALLOC
    d_buf = (ush *) zcalloc(DIST_BUFSIZE, sizeof(ush));
    l_buf = (uch *) zcalloc(LIT_BUFSIZE/2, 2);
    /* Avoid using the value 64K on 16 bit machines */
    if (l_buf == NULL || d_buf == NULL)
        ziperr(ZE_MEM, "ct_init: out of memory");
#endif

    /* Initialize the mapping length (0..255) -> length code (0..28) */
    length = 0;
    for (code = 0; code < LENGTH_CODES-1; code++) {
        base_length[code] = length;
        for (n = 0; n < (1<<extra_lbits[code]); n++) {
            length_code[length++] = (uch)code;
        }
    }
    Assert(length == 256, "ct_init: length != 256");
    /* Note that the length 255 (match length 258) can be represented
     * in two different ways: code 284 + 5 bits or code 285, so we
     * overwrite length_code[255] to use the best encoding:
     */
    length_code[length-1] = (uch)code;

    /* Initialize the mapping dist (0..32K) -> dist code (0..29) */
    dist = 0;
    for (code = 0 ; code < 16; code++) {
        base_dist[code] = dist;
        for (n = 0; n < (1<<extra_dbits[code]); n++) {
            dist_code[dist++] = (uch)code;
        }
    }
    Assert(dist == 256, "ct_init: dist != 256");
    dist >>= 7; /* from now on, all distances are divided by 128 */
    for ( ; code < D_CODES; code++) {
        base_dist[code] = dist << 7;
        for (n = 0; n < (1<<(extra_dbits[code]-7)); n++) {
            dist_code[256 + dist++] = (uch)code;
        }
    }
    Assert(dist == 256, "ct_init: 256+dist != 512");

    /* Construct the codes of the static literal tree */
    for (bits = 0; bits <= MAX_BITS; bits++) bl_count[bits] = 0;
    n = 0;
    while (n <= 143) static_ltree[n++].Len = 8, bl_count[8]++;
    while (n <= 255) static_ltree[n++].Len = 9, bl_count[9]++;
    while (n <= 279) static_ltree[n++].Len = 7, bl_count[7]++;
    while (n <= 287) static_ltree[n++].Len = 8, bl_count[8]++;
    /* Codes 286 and 287 do not exist, but we must include them in the
     * tree construction to get a canonical Huffman tree (longest code
     * all ones)
     */
    gen_codes((ct_data near *)static_ltree, L_CODES+1);

    /* The static distance tree is trivial: */
    for (n = 0; n < D_CODES; n++) {
        static_dtree[n].Len = 5;
        static_dtree[n].Code = (ush)bi_reverse(n, 5);
    }

    /* Initialize the first block of the first file: */
    init_block();
}